

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlStaticCopyNode(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent,int extended)

{
  xmlElementType xVar1;
  xmlDocPtr pxVar2;
  xmlNodePtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlRegisterNodeFunc *pp_Var6;
  xmlNodePtr pxVar7;
  xmlNsPtr pxVar8;
  xmlNs *pxVar9;
  xmlAttrPtr pxVar10;
  xmlEntityPtr pxVar11;
  xmlNodePtr pxVar12;
  _xmlNode *parent_00;
  _xmlNode **pp_Var13;
  _xmlNode *p_Var14;
  _xmlNode *p_Var15;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  switch(node->type) {
  case XML_ATTRIBUTE_NODE:
    pxVar3 = (xmlNodePtr)xmlCopyPropInternal(doc,parent,(xmlAttrPtr)node);
    return pxVar3;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar2 = xmlCopyDoc((xmlDocPtr)node,extended);
    return (xmlNodePtr)pxVar2;
  case XML_DOCUMENT_TYPE_NODE:
  case XML_NOTATION_NODE:
  case XML_DTD_NODE:
  case XML_ELEMENT_DECL:
  case XML_ATTRIBUTE_DECL:
  case XML_ENTITY_DECL:
    goto switchD_00184344_caseD_a;
  case XML_NAMESPACE_DECL:
    pxVar3 = (xmlNodePtr)xmlCopyNamespaceList((xmlNsPtr)node);
    return pxVar3;
  }
  pxVar3 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar3 == (xmlNodePtr)0x0) {
    __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"copying node");
    return (xmlNodePtr)0x0;
  }
  pxVar3->nsDef = (xmlNs *)0x0;
  pxVar3->psvi = (void *)0x0;
  pxVar3->content = (xmlChar *)0x0;
  pxVar3->properties = (_xmlAttr *)0x0;
  pxVar3->doc = (_xmlDoc *)0x0;
  pxVar3->ns = (xmlNs *)0x0;
  pxVar3->next = (_xmlNode *)0x0;
  pxVar3->prev = (_xmlNode *)0x0;
  pxVar3->last = (_xmlNode *)0x0;
  pxVar3->parent = (_xmlNode *)0x0;
  pxVar3->name = (xmlChar *)0x0;
  pxVar3->children = (_xmlNode *)0x0;
  pxVar3->_private = (void *)0x0;
  *(undefined8 *)&pxVar3->type = 0;
  pxVar3->line = 0;
  pxVar3->extra = 0;
  *(undefined4 *)&pxVar3->field_0x74 = 0;
  pxVar3->type = node->type;
  pxVar3->doc = doc;
  pxVar3->parent = parent;
  pxVar5 = node->name;
  pxVar4 = "text";
  if (((pxVar5 == "text") || (pxVar4 = "textnoenc", pxVar5 == "textnoenc")) ||
     (pxVar4 = "comment", pxVar5 == "comment")) {
LAB_00184469:
    pxVar3->name = pxVar4;
  }
  else if (pxVar5 != (xmlChar *)0x0) {
    if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
      pxVar4 = xmlStrdup(pxVar5);
    }
    else {
      pxVar4 = xmlDictLookup(doc->dict,pxVar5,-1);
    }
    goto LAB_00184469;
  }
  xVar1 = node->type;
  if (xVar1 == XML_ELEMENT_NODE) {
    pxVar3->line = node->line;
  }
  else if ((node->content != (xmlChar *)0x0) &&
          ((XML_XINCLUDE_END < xVar1 ||
           ((0x180020U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
    pxVar5 = xmlStrdup(node->content);
    pxVar3->content = pxVar5;
  }
  if (parent != (xmlNodePtr)0x0) {
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var6 = __xmlRegisterNodeDefaultValue(), *pp_Var6 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var6 = __xmlRegisterNodeDefaultValue();
      (**pp_Var6)(pxVar3);
    }
    pxVar7 = xmlAddChild(parent,pxVar3);
    if (pxVar7 != pxVar3) {
      return pxVar7;
    }
  }
  if (extended != 0) {
    if (((node->type == XML_XINCLUDE_START) || (node->type == XML_ELEMENT_NODE)) &&
       (node->nsDef != (xmlNsPtr)0x0)) {
      pxVar8 = xmlCopyNamespaceList(node->nsDef);
      pxVar3->nsDef = pxVar8;
    }
    if (node->ns != (xmlNs *)0x0) {
      pxVar9 = xmlSearchNs(doc,pxVar3,node->ns->prefix);
      if (pxVar9 == (xmlNsPtr)0x0) {
        pxVar8 = xmlSearchNs(node->doc,node,node->ns->prefix);
        p_Var14 = pxVar3;
        if (pxVar8 == (xmlNsPtr)0x0) {
          pxVar9 = xmlNewReconciledNs(doc,pxVar3,node->ns);
        }
        else {
          do {
            pxVar7 = p_Var14;
            p_Var14 = pxVar7->parent;
          } while (p_Var14 != (_xmlNode *)0x0);
          pxVar9 = xmlNewNs(pxVar7,pxVar8->href,pxVar8->prefix);
        }
      }
      pxVar3->ns = pxVar9;
    }
    xVar1 = node->type;
    if (((xVar1 == XML_XINCLUDE_START) || (xVar1 == XML_ELEMENT_NODE)) &&
       (node->properties != (xmlAttrPtr)0x0)) {
      pxVar10 = xmlCopyPropList(pxVar3,node->properties);
      pxVar3->properties = pxVar10;
      xVar1 = node->type;
    }
    if (xVar1 == XML_ENTITY_REF_NODE) {
      if ((doc == (xmlDocPtr)0x0) || (node->doc != doc)) {
        pxVar11 = xmlGetDocEntity(doc,pxVar3->name);
      }
      else {
        pxVar11 = (xmlEntityPtr)node->children;
      }
      pxVar3->children = (_xmlNode *)pxVar11;
      pxVar3->last = (_xmlNode *)pxVar11;
    }
    else {
      p_Var14 = node->children;
      if (extended != 2 && p_Var14 != (xmlNodePtr)0x0) {
        pxVar12 = xmlStaticCopyNode(p_Var14,doc,pxVar3,2);
        pxVar7 = pxVar3;
        while (parent_00 = pxVar12, parent_00 != (_xmlNode *)0x0) {
          p_Var15 = pxVar7->last;
          if (p_Var15 != parent_00) {
            if (p_Var15 == (_xmlNode *)0x0) {
              pp_Var13 = &pxVar7->children;
            }
            else {
              parent_00->prev = p_Var15;
              pp_Var13 = &p_Var15->next;
            }
            *pp_Var13 = parent_00;
            pxVar7->last = parent_00;
          }
          if ((p_Var14->type == XML_ENTITY_REF_NODE) ||
             (p_Var15 = p_Var14->children, p_Var15 == (_xmlNode *)0x0)) {
            while (parent_00 = pxVar7, p_Var15 = p_Var14->next, p_Var15 == (_xmlNode *)0x0) {
              p_Var14 = p_Var14->parent;
              pxVar7 = parent_00->parent;
              if (p_Var14 == node) goto LAB_0018467c;
            }
          }
          pxVar12 = xmlStaticCopyNode(p_Var15,doc,parent_00,2);
          p_Var14 = p_Var15;
          pxVar7 = parent_00;
        }
        xmlFreeNode(pxVar3);
switchD_00184344_caseD_a:
        return (xmlNodePtr)0x0;
      }
    }
  }
LAB_0018467c:
  if (parent != (xmlNodePtr)0x0) {
    return pxVar3;
  }
  if (__xmlRegisterCallbacks != 0) {
    pp_Var6 = __xmlRegisterNodeDefaultValue();
    if (*pp_Var6 != (xmlRegisterNodeFunc)0x0) {
      pp_Var6 = __xmlRegisterNodeDefaultValue();
      (**pp_Var6)(pxVar3);
      return pxVar3;
    }
    return pxVar3;
  }
  return pxVar3;
}

Assistant:

xmlNodePtr
xmlStaticCopyNode(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent,
                  int extended) {
    xmlNodePtr ret;

    if (node == NULL) return(NULL);
    switch (node->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    break;
        case XML_ATTRIBUTE_NODE:
		return((xmlNodePtr) xmlCopyPropInternal(doc, parent, (xmlAttrPtr) node));
        case XML_NAMESPACE_DECL:
	    return((xmlNodePtr) xmlCopyNamespaceList((xmlNsPtr) node));

        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_TREE_ENABLED
	    return((xmlNodePtr) xmlCopyDoc((xmlDocPtr) node, extended));
#endif /* LIBXML_TREE_ENABLED */
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
            return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (ret == NULL) {
	xmlTreeErrMemory("copying node");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNode));
    ret->type = node->type;

    ret->doc = doc;
    ret->parent = parent;
    if (node->name == xmlStringText)
	ret->name = xmlStringText;
    else if (node->name == xmlStringTextNoenc)
	ret->name = xmlStringTextNoenc;
    else if (node->name == xmlStringComment)
	ret->name = xmlStringComment;
    else if (node->name != NULL) {
        if ((doc != NULL) && (doc->dict != NULL))
	    ret->name = xmlDictLookup(doc->dict, node->name, -1);
	else
	    ret->name = xmlStrdup(node->name);
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->content != NULL) &&
	(node->type != XML_ENTITY_REF_NODE) &&
	(node->type != XML_XINCLUDE_END) &&
	(node->type != XML_XINCLUDE_START)) {
	ret->content = xmlStrdup(node->content);
    }else{
      if (node->type == XML_ELEMENT_NODE)
        ret->line = node->line;
    }
    if (parent != NULL) {
	xmlNodePtr tmp;

	/*
	 * this is a tricky part for the node register thing:
	 * in case ret does get coalesced in xmlAddChild
	 * the deregister-node callback is called; so we register ret now already
	 */
	if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	    xmlRegisterNodeDefaultValue((xmlNodePtr)ret);

        /*
         * Note that since ret->parent is already set, xmlAddChild will
         * return early and not actually insert the node. It will only
         * coalesce text nodes and unnecessarily call xmlSetTreeDoc.
         * Assuming that the subtree to be copied always has its text
         * nodes coalesced, the somewhat confusing call to xmlAddChild
         * could be removed.
         */
        tmp = xmlAddChild(parent, ret);
	/* node could have coalesced */
	if (tmp != ret)
	    return(tmp);
    }

    if (!extended)
	goto out;
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->nsDef != NULL))
        ret->nsDef = xmlCopyNamespaceList(node->nsDef);

    if (node->ns != NULL) {
        xmlNsPtr ns;

	ns = xmlSearchNs(doc, ret, node->ns->prefix);
	if (ns == NULL) {
	    /*
	     * Humm, we are copying an element whose namespace is defined
	     * out of the new tree scope. Search it in the original tree
	     * and add it at the top of the new tree
	     */
	    ns = xmlSearchNs(node->doc, node, node->ns->prefix);
	    if (ns != NULL) {
	        xmlNodePtr root = ret;

		while (root->parent != NULL) root = root->parent;
		ret->ns = xmlNewNs(root, ns->href, ns->prefix);
		} else {
			ret->ns = xmlNewReconciledNs(doc, ret, node->ns);
	    }
	} else {
	    /*
	     * reference the existing namespace definition in our own tree.
	     */
	    ret->ns = ns;
	}
    }
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->properties != NULL))
        ret->properties = xmlCopyPropList(ret, node->properties);
    if (node->type == XML_ENTITY_REF_NODE) {
	if ((doc == NULL) || (node->doc != doc)) {
	    /*
	     * The copied node will go into a separate document, so
	     * to avoid dangling references to the ENTITY_DECL node
	     * we cannot keep the reference. Try to find it in the
	     * target document.
	     */
	    ret->children = (xmlNodePtr) xmlGetDocEntity(doc, ret->name);
	} else {
            ret->children = node->children;
	}
	ret->last = ret->children;
    } else if ((node->children != NULL) && (extended != 2)) {
        xmlNodePtr cur, insert;

        cur = node->children;
        insert = ret;
        while (cur != NULL) {
            xmlNodePtr copy = xmlStaticCopyNode(cur, doc, insert, 2);
            if (copy == NULL) {
                xmlFreeNode(ret);
                return(NULL);
            }

            /* Check for coalesced text nodes */
            if (insert->last != copy) {
                if (insert->last == NULL) {
                    insert->children = copy;
                } else {
                    copy->prev = insert->last;
                    insert->last->next = copy;
                }
                insert->last = copy;
            }

            if ((cur->type != XML_ENTITY_REF_NODE) &&
                (cur->children != NULL)) {
                cur = cur->children;
                insert = copy;
                continue;
            }

            while (1) {
                if (cur->next != NULL) {
                    cur = cur->next;
                    break;
                }

                cur = cur->parent;
                insert = insert->parent;
                if (cur == node) {
                    cur = NULL;
                    break;
                }
            }
        }
    }

out:
    /* if parent != NULL we already registered the node above */
    if ((parent == NULL) &&
        ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue)))
	xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    return(ret);
}